

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

void set_block_bits(uint8_t *pBytes,uint32_t val,uint32_t num_bits,uint32_t *pCur_ofs)

{
  uint32_t uVar1;
  uint *in_RCX;
  uint32_t in_EDX;
  uint in_ESI;
  long in_RDI;
  uint32_t n;
  undefined4 local_10;
  undefined4 local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  while (local_10 != 0) {
    uVar1 = minimumu(8 - (*in_RCX & 7),local_10);
    *(byte *)(in_RDI + (ulong)(*in_RCX >> 3)) =
         *(byte *)(in_RDI + (ulong)(*in_RCX >> 3)) | (byte)(local_c << ((byte)*in_RCX & 7));
    local_c = local_c >> ((byte)uVar1 & 0x1f);
    local_10 = local_10 - uVar1;
    *in_RCX = uVar1 + *in_RCX;
  }
  return;
}

Assistant:

static void set_block_bits(uint8_t *pBytes, uint32_t val, uint32_t num_bits, uint32_t *pCur_ofs)
{
	assert((num_bits <= 32) && (val < (1ULL << num_bits)));
	while (num_bits)
	{
		const uint32_t n = minimumu(8 - (*pCur_ofs & 7), num_bits);
		pBytes[*pCur_ofs >> 3] |= (uint8_t)(val << (*pCur_ofs & 7));
		val >>= n;
		num_bits -= n;
		*pCur_ofs += n;
	}
	assert(*pCur_ofs <= 128);
}